

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O0

void __thiscall amrex::AmrMesh::SetBoxArray(AmrMesh *this,int lev,BoxArray *ba_in)

{
  bool bVar1;
  BoxArray *in_RDX;
  BoxArray *in_RDI;
  BoxArray *in_stack_ffffffffffffffd8;
  
  in_RDI[2].m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2] =
       in_RDI[2].m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2] + 1;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_RDI,
             (size_type)in_stack_ffffffffffffffd8);
  bVar1 = BoxArray::operator!=(in_RDI,in_stack_ffffffffffffffd8);
  if (bVar1) {
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_RDI,(size_type)in_RDX
              );
    BoxArray::operator=(in_RDI,in_RDX);
  }
  return;
}

Assistant:

void
AmrMesh::SetBoxArray (int lev, const BoxArray& ba_in) noexcept
{
    ++num_setba;
    if (grids[lev] != ba_in) grids[lev] = ba_in;
}